

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins.c
# Opt level: O2

void * lys_ext_complex_get_substmt(LY_STMT stmt,lys_ext_instance_complex *ext,lyext_substmt **info)

{
  LY_STMT LVar1;
  lyext_plugin *plVar2;
  lyext_substmt *plVar3;
  long lVar4;
  
  if ((((ext == (lys_ext_instance_complex *)0x0) || (ext->def == (lys_ext *)0x0)) ||
      (plVar2 = ext->def->plugin, plVar2 == (lyext_plugin *)0x0)) || (plVar2->type != LYEXT_COMPLEX)
     ) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).",
           "lys_ext_complex_get_substmt");
  }
  else {
    plVar3 = ext->substmt;
    if (plVar3 == (lyext_substmt *)0x0) {
      if (info != (lyext_substmt **)0x0) {
        *info = (lyext_substmt *)0x0;
      }
    }
    else {
      for (lVar4 = 0; LVar1 = *(LY_STMT *)((long)&plVar3->stmt + lVar4), LVar1 != LY_STMT_UNKNOWN;
          lVar4 = lVar4 + 0x18) {
        if (stmt == LY_STMT_NODE) {
          if ((uint)(LVar1 + ~LY_STMT_MODULE) < 0xe) goto LAB_0016ae7b;
        }
        else if (LVar1 == stmt) {
LAB_0016ae7b:
          if (info != (lyext_substmt **)0x0) {
            *info = (lyext_substmt *)((long)&plVar3->stmt + lVar4);
          }
          break;
        }
      }
      if (*(int *)((long)&ext->substmt->stmt + lVar4) != 0) {
        return ext->content + *(long *)((long)&ext->substmt->offset + lVar4);
      }
    }
  }
  return (void *)0x0;
}

Assistant:

API void *
lys_ext_complex_get_substmt(LY_STMT stmt, struct lys_ext_instance_complex *ext, struct lyext_substmt **info)
{
    int i;

    if (!ext || !ext->def || !ext->def->plugin || ext->def->plugin->type != LYEXT_COMPLEX) {
        LOGARG;
        return NULL;
    }

    if (!ext->substmt) {
        /* no substatement defined in the plugin */
        if (info) {
            *info = NULL;
        }
        return NULL;
    }

    /* search the substatements defined by the plugin */
    for (i = 0; ext->substmt[i].stmt; i++) {
        if (stmt == LY_STMT_NODE) {
            if (ext->substmt[i].stmt >= LY_STMT_ACTION && ext->substmt[i].stmt <= LY_STMT_USES) {
                if (info) {
                    *info = &ext->substmt[i];
                }
                break;
            }
        } else if (ext->substmt[i].stmt == stmt) {
            if (info) {
                *info = &ext->substmt[i];
            }
            break;
        }
    }

    if (ext->substmt[i].stmt) {
        return &ext->content[ext->substmt[i].offset];
    } else {
        return NULL;
    }
}